

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86.cpp
# Opt level: O0

int __thiscall ncnn::ELU_x86::forward_inplace(ELU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long *in_RSI;
  long *in_RDI;
  int iVar3;
  double dVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  float fVar9;
  undefined1 auVar7 [16];
  float fVar10;
  __m128 _p;
  __m128 _alpha128;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m128 neg;
  __m128 pos;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  int local_890;
  undefined8 local_880;
  undefined8 local_878;
  undefined8 local_870;
  undefined4 local_868;
  long local_860;
  undefined4 local_858;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined8 local_840;
  undefined1 (*local_838) [16];
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  int local_81c;
  long *local_810;
  undefined1 local_7fd;
  int local_7fc;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7d8;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  undefined1 (*pauStack_7b0) [16];
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  undefined1 (*local_790) [16];
  undefined8 local_788;
  undefined8 uStack_780;
  undefined1 local_778 [16];
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined4 local_748;
  undefined4 uStack_744;
  undefined4 uStack_740;
  undefined4 uStack_73c;
  undefined4 local_738;
  long local_728;
  undefined4 local_71c;
  long local_718;
  undefined1 (*local_710) [16];
  undefined4 local_704;
  int local_700;
  int local_6fc;
  undefined8 *local_6f8;
  undefined4 local_6ec;
  long local_6e8;
  undefined8 *local_6c8;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  ulong local_3e8;
  ulong uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_81c = *(int *)((long)in_RSI + 0x2c);
  local_820 = (int)in_RSI[6];
  local_824 = (int)in_RSI[7];
  local_828 = (int)in_RSI[3];
  local_82c = local_81c * local_820 * local_828;
  local_810 = in_RSI;
  for (local_830 = 0; local_830 < local_824; local_830 = local_830 + 1) {
    local_7f0 = &local_880;
    local_6fc = *(int *)((long)local_810 + 0x2c);
    local_700 = (int)local_810[6];
    local_704 = *(undefined4 *)((long)local_810 + 0x34);
    local_710 = (undefined1 (*) [16])(*local_810 + local_810[8] * (long)local_830 * local_810[2]);
    local_718 = local_810[2];
    local_71c = (undefined4)local_810[3];
    local_728 = local_810[4];
    local_6f8 = &local_880;
    local_6e8 = (long)local_6fc * (long)local_700 * local_718;
    local_7e8 = &local_880;
    local_7d8 = &local_880;
    local_6ec = 0x10;
    local_7fc = local_830;
    local_7fd = 1;
    local_880 = 0;
    local_870 = 0;
    local_868 = 0;
    local_858 = 0;
    local_854 = 0;
    local_850 = 0;
    local_84c = 0;
    local_848 = 0;
    local_840 = 0;
    local_878 = 0;
    local_890 = 0;
    local_7c8 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_838 = local_710;
    for (; fStack_7c4 = local_7c8, fStack_7c0 = local_7c8, fStack_7bc = local_7c8,
        local_7b8 = local_7c8, local_6c8 = local_7d8, local_860 = local_728,
        local_890 + 3 < local_82c; local_890 = local_890 + 4) {
      pauStack_7b0 = local_838;
      local_758 = *(undefined8 *)*local_838;
      uStack_750 = *(undefined8 *)(*local_838 + 8);
      local_790 = local_838;
      local_668 = 0;
      uStack_660 = 0;
      local_688 = 0;
      uStack_680 = 0;
      local_778 = maxps(ZEXT816(0),*local_838);
      local_678 = 0;
      uStack_670 = 0;
      local_648 = 0;
      uStack_640 = 0;
      auVar7 = minps(ZEXT816(0),*local_838);
      local_788 = auVar7._0_8_;
      uStack_780 = auVar7._8_8_;
      local_578 = 0;
      uStack_570 = 0;
      local_5e8 = 0x3f8000003f800000;
      uStack_5e0 = 0x3f8000003f800000;
      local_558 = local_788;
      uStack_550 = uStack_780;
      local_568 = 0x42b0c0a542b0c0a5;
      uStack_560 = 0x42b0c0a542b0c0a5;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = minps(auVar7,auVar5);
      local_5a8 = auVar5._0_8_;
      local_588 = local_5a8;
      uStack_5a0 = auVar5._8_8_;
      uStack_580 = uStack_5a0;
      local_598 = 0xc2b0c0a5c2b0c0a5;
      uStack_590 = 0xc2b0c0a5c2b0c0a5;
      auVar7._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7 = maxps(auVar5,auVar7);
      local_5a8 = auVar7._0_8_;
      uVar1 = local_5a8;
      uStack_5a0 = auVar7._8_8_;
      uVar2 = uStack_5a0;
      local_488 = 0x3fb8aa3b3fb8aa3b;
      uStack_480 = 0x3fb8aa3b3fb8aa3b;
      local_478._0_4_ = auVar7._0_4_;
      local_478._4_4_ = auVar7._4_4_;
      uStack_470._0_4_ = auVar7._8_4_;
      uStack_470._4_4_ = auVar7._12_4_;
      local_4f8 = CONCAT44(local_478._4_4_ * 1.442695,(float)local_478 * 1.442695);
      uStack_4f0 = CONCAT44(uStack_470._4_4_ * 1.442695,(float)uStack_470 * 1.442695);
      local_508 = 0x3f0000003f000000;
      uStack_500 = 0x3f0000003f000000;
      fVar6 = (float)local_478 * 1.442695 + 0.5;
      fVar8 = local_478._4_4_ * 1.442695 + 0.5;
      fVar9 = (float)uStack_470 * 1.442695 + 0.5;
      fVar10 = uStack_470._4_4_ * 1.442695 + 0.5;
      local_438 = CONCAT44(fVar8,fVar6);
      uStack_430 = CONCAT44(fVar10,fVar9);
      local_428 = CONCAT44((int)fVar8,(int)fVar6);
      uStack_420 = CONCAT44((int)fVar10,(int)fVar9);
      local_5c8 = (float)(int)fVar6;
      fStack_5c4 = (float)(int)fVar8;
      fStack_5c0 = (float)(int)fVar9;
      fStack_5bc = (float)(int)fVar10;
      local_5b8 = CONCAT44(fStack_5c4,local_5c8);
      uStack_5b0 = CONCAT44(fStack_5bc,fStack_5c0);
      local_408 = local_5b8;
      uStack_400 = uStack_5b0;
      local_418 = CONCAT44(fVar8,fVar6);
      uStack_410 = CONCAT44(fVar10,fVar9);
      local_5f8 = CONCAT44(-(uint)(fVar8 < fStack_5c4),-(uint)(fVar6 < local_5c8));
      uStack_5f0 = CONCAT44(-(uint)(fVar10 < fStack_5bc),-(uint)(fVar9 < fStack_5c0));
      local_3e8 = local_5f8;
      uStack_3e0 = uStack_5f0;
      local_3f8 = 0x3f8000003f800000;
      uStack_3f0 = 0x3f8000003f800000;
      local_5f8 = local_5f8 & 0x3f8000003f800000;
      uStack_5f0 = uStack_5f0 & 0x3f8000003f800000;
      local_538 = local_5b8;
      uStack_530 = uStack_5b0;
      local_548._0_4_ = (float)local_5f8;
      local_548._4_4_ = (float)(local_5f8 >> 0x20);
      uStack_540._0_4_ = (float)uStack_5f0;
      uStack_540._4_4_ = (float)(uStack_5f0 >> 0x20);
      local_5c8 = local_5c8 - (float)local_548;
      fStack_5c4 = fStack_5c4 - local_548._4_4_;
      fStack_5c0 = fStack_5c0 - (float)uStack_540;
      fStack_5bc = fStack_5bc - uStack_540._4_4_;
      local_348 = CONCAT44(fStack_5c4,local_5c8);
      uStack_340 = CONCAT44(fStack_5bc,fStack_5c0);
      local_368 = local_5a8;
      uStack_360 = uStack_5a0;
      local_358 = 0x3f3180003f318000;
      uStack_350 = 0x3f3180003f318000;
      local_328 = local_5a8;
      uStack_320 = uStack_5a0;
      local_318 = 0x3f3180003f318000;
      uStack_310 = 0x3f3180003f318000;
      local_338 = local_5c8 * 0.6933594;
      fStack_334 = fStack_5c4 * 0.6933594;
      fStack_330 = fStack_5c0 * 0.6933594;
      fStack_32c = fStack_5bc * 0.6933594;
      local_5a8 = CONCAT44(local_478._4_4_ - fStack_334,(float)local_478 - local_338);
      uStack_5a0._0_4_ = (float)uStack_470 - fStack_330;
      uStack_5a0._4_4_ = uStack_470._4_4_ - fStack_32c;
      local_3b8 = CONCAT44(fStack_5c4,local_5c8);
      uStack_3b0 = CONCAT44(fStack_5bc,fStack_5c0);
      local_3d8 = local_5a8;
      uStack_3d0 = uStack_5a0;
      local_3c8 = 0xb95e8083b95e8083;
      uStack_3c0 = 0xb95e8083b95e8083;
      local_398 = local_5a8;
      uStack_390 = uStack_5a0;
      local_388 = 0xb95e8083b95e8083;
      uStack_380 = 0xb95e8083b95e8083;
      local_3a8 = local_5c8 * -0.00021219444;
      fStack_3a4 = fStack_5c4 * -0.00021219444;
      fStack_3a0 = fStack_5c0 * -0.00021219444;
      fStack_39c = fStack_5bc * -0.00021219444;
      fVar6 = ((float)local_478 - local_338) - local_3a8;
      fVar8 = (local_478._4_4_ - fStack_334) - fStack_3a4;
      fVar9 = ((float)uStack_470 - fStack_330) - fStack_3a0;
      fVar10 = (uStack_470._4_4_ - fStack_32c) - fStack_39c;
      local_5a8 = CONCAT44(fVar8,fVar6);
      uStack_5a0._0_4_ = fVar9;
      uStack_5a0._4_4_ = fVar10;
      local_4a8 = local_5a8;
      uStack_4a0 = uStack_5a0;
      local_5b8 = CONCAT44(fVar8 * fVar8,fVar6 * fVar6);
      uStack_5b0 = CONCAT44(fVar10 * fVar10,fVar9 * fVar9);
      local_a8 = 0x3950696739506967;
      uStack_a0 = 0x3950696739506967;
      local_b8 = local_5a8;
      uStack_b0 = uStack_5a0;
      local_c8 = 0x3ab743ce3ab743ce;
      uStack_c0 = 0x3ab743ce3ab743ce;
      local_68 = 0x3950696739506967;
      uStack_60 = 0x3950696739506967;
      local_78 = local_5a8;
      uStack_70 = uStack_5a0;
      local_88 = fVar6 * 0.00019875691;
      fStack_84 = fVar8 * 0.00019875691;
      fStack_80 = fVar9 * 0.00019875691;
      fStack_7c = fVar10 * 0.00019875691;
      local_98 = 0x3ab743ce3ab743ce;
      uStack_90 = 0x3ab743ce3ab743ce;
      local_608 = CONCAT44(fStack_84 + 0.0013981999,local_88 + 0.0013981999);
      uStack_600 = CONCAT44(fStack_7c + 0.0013981999,fStack_80 + 0.0013981999);
      local_118 = local_608;
      uStack_110 = uStack_600;
      local_128 = local_5a8;
      uStack_120 = uStack_5a0;
      local_138 = 0x3c0889083c088908;
      uStack_130 = 0x3c0889083c088908;
      local_d8 = local_608;
      uStack_d0 = uStack_600;
      local_e8 = local_5a8;
      uStack_e0 = uStack_5a0;
      local_f8 = (local_88 + 0.0013981999) * fVar6;
      fStack_f4 = (fStack_84 + 0.0013981999) * fVar8;
      fStack_f0 = (fStack_80 + 0.0013981999) * fVar9;
      fStack_ec = (fStack_7c + 0.0013981999) * fVar10;
      local_108 = 0x3c0889083c088908;
      uStack_100 = 0x3c0889083c088908;
      local_608 = CONCAT44(fStack_f4 + 0.008333452,local_f8 + 0.008333452);
      uStack_600 = CONCAT44(fStack_ec + 0.008333452,fStack_f0 + 0.008333452);
      local_188 = local_608;
      uStack_180 = uStack_600;
      local_198 = local_5a8;
      uStack_190 = uStack_5a0;
      local_1a8 = 0x3d2aa9c13d2aa9c1;
      uStack_1a0 = 0x3d2aa9c13d2aa9c1;
      local_148 = local_608;
      uStack_140 = uStack_600;
      local_158 = local_5a8;
      uStack_150 = uStack_5a0;
      local_168 = (local_f8 + 0.008333452) * fVar6;
      fStack_164 = (fStack_f4 + 0.008333452) * fVar8;
      fStack_160 = (fStack_f0 + 0.008333452) * fVar9;
      fStack_15c = (fStack_ec + 0.008333452) * fVar10;
      local_178 = 0x3d2aa9c13d2aa9c1;
      uStack_170 = 0x3d2aa9c13d2aa9c1;
      local_608 = CONCAT44(fStack_164 + 0.041665796,local_168 + 0.041665796);
      uStack_600 = CONCAT44(fStack_15c + 0.041665796,fStack_160 + 0.041665796);
      local_1f8 = local_608;
      uStack_1f0 = uStack_600;
      local_208 = local_5a8;
      uStack_200 = uStack_5a0;
      local_218 = 0x3e2aaaaa3e2aaaaa;
      uStack_210 = 0x3e2aaaaa3e2aaaaa;
      local_1b8 = local_608;
      uStack_1b0 = uStack_600;
      local_1c8 = local_5a8;
      uStack_1c0 = uStack_5a0;
      local_1d8 = (local_168 + 0.041665796) * fVar6;
      fStack_1d4 = (fStack_164 + 0.041665796) * fVar8;
      fStack_1d0 = (fStack_160 + 0.041665796) * fVar9;
      fStack_1cc = (fStack_15c + 0.041665796) * fVar10;
      local_1e8 = 0x3e2aaaaa3e2aaaaa;
      uStack_1e0 = 0x3e2aaaaa3e2aaaaa;
      local_608 = CONCAT44(fStack_1d4 + 0.16666666,local_1d8 + 0.16666666);
      uStack_600 = CONCAT44(fStack_1cc + 0.16666666,fStack_1d0 + 0.16666666);
      local_268 = local_608;
      uStack_260 = uStack_600;
      local_278 = local_5a8;
      uStack_270 = uStack_5a0;
      local_228 = local_608;
      uStack_220 = uStack_600;
      local_238 = local_5a8;
      uStack_230 = uStack_5a0;
      local_248 = (local_1d8 + 0.16666666) * fVar6;
      fStack_244 = (fStack_1d4 + 0.16666666) * fVar8;
      fStack_240 = (fStack_1d0 + 0.16666666) * fVar9;
      fStack_23c = (fStack_1cc + 0.16666666) * fVar10;
      local_258 = 0x3f0000003f000000;
      uStack_250 = 0x3f0000003f000000;
      local_608 = CONCAT44(fStack_244 + 0.5,local_248 + 0.5);
      uStack_600 = CONCAT44(fStack_23c + 0.5,fStack_240 + 0.5);
      local_2d8 = local_608;
      uStack_2d0 = uStack_600;
      local_2e8 = local_5b8;
      uStack_2e0 = uStack_5b0;
      local_2f8 = local_5a8;
      uStack_2f0 = uStack_5a0;
      local_298 = local_608;
      uStack_290 = uStack_600;
      local_2a8 = local_5b8;
      uStack_2a0 = uStack_5b0;
      local_2b8 = (local_248 + 0.5) * fVar6 * fVar6;
      fStack_2b4 = (fStack_244 + 0.5) * fVar8 * fVar8;
      fStack_2b0 = (fStack_240 + 0.5) * fVar9 * fVar9;
      fStack_2ac = (fStack_23c + 0.5) * fVar10 * fVar10;
      local_2c8 = local_5a8;
      uStack_2c0 = uStack_5a0;
      local_608 = CONCAT44(fStack_2b4 + fVar8,local_2b8 + fVar6);
      uStack_600 = CONCAT44(fStack_2ac + fVar10,fStack_2b0 + fVar9);
      local_518 = local_608;
      uStack_510 = uStack_600;
      local_528 = 0x3f8000003f800000;
      uStack_520 = 0x3f8000003f800000;
      local_4e8 = local_2b8 + fVar6 + 1.0;
      fStack_4e4 = fStack_2b4 + fVar8 + 1.0;
      fStack_4e0 = fStack_2b0 + fVar9 + 1.0;
      fStack_4dc = fStack_2ac + fVar10 + 1.0;
      local_608 = CONCAT44(fStack_4e4,local_4e8);
      uStack_600 = CONCAT44(fStack_4dc,fStack_4e0);
      local_448 = CONCAT44(fStack_5c4,local_5c8);
      uStack_440 = CONCAT44(fStack_5bc,fStack_5c0);
      local_48 = CONCAT44((int)fStack_5c4,(int)local_5c8);
      uStack_40 = CONCAT44((int)fStack_5bc,(int)fStack_5c0);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar3 = (int)local_5c8 + 0x7f;
      fStack_5d4 = (float)((int)fStack_5c4 + 0x7f);
      fStack_5d0 = (float)((int)fStack_5c0 + 0x7f);
      fStack_5cc = (float)((int)fStack_5bc + 0x7f);
      local_28 = CONCAT44(fStack_5d4,iVar3);
      uStack_20 = CONCAT44(fStack_5cc,fStack_5d0);
      local_2c = 0x17;
      local_5d8 = (float)(iVar3 * 0x800000);
      local_618 = CONCAT44(fStack_5d4,local_5d8);
      uStack_610 = CONCAT44(fStack_5cc,fStack_5d0);
      local_4b8 = local_608;
      uStack_4b0 = uStack_600;
      local_4e8 = local_4e8 * local_5d8;
      fStack_4e4 = fStack_4e4 * fStack_5d4;
      fStack_4e0 = fStack_4e0 * fStack_5d0;
      fStack_4dc = fStack_4dc * fStack_5cc;
      local_608 = CONCAT44(fStack_4e4,local_4e8);
      uStack_600 = CONCAT44(fStack_4dc,fStack_4e0);
      local_628 = local_608;
      uStack_620 = uStack_600;
      local_738 = 0x3f800000;
      local_748 = 0x3f800000;
      local_638 = 0x3f8000003f800000;
      uStack_630 = 0x3f8000003f800000;
      local_4e8 = local_4e8 - 1.0;
      fStack_4e4 = fStack_4e4 - 1.0;
      fStack_4e0 = fStack_4e0 - 1.0;
      fStack_4dc = fStack_4dc - 1.0;
      local_788 = CONCAT44(fStack_4e4,local_4e8);
      uStack_780._0_4_ = fStack_4e0;
      uStack_780._4_4_ = fStack_4dc;
      local_468 = local_788;
      uStack_460 = uStack_780;
      local_4e8 = local_7c8 * local_4e8;
      fStack_4e4 = local_7c8 * fStack_4e4;
      fStack_4e0 = local_7c8 * fStack_4e0;
      fStack_4dc = local_7c8 * fStack_4dc;
      local_4d8._0_4_ = local_778._0_4_;
      local_4d8._4_4_ = local_778._4_4_;
      fStack_4d0 = local_778._8_4_;
      fStack_4cc = local_778._12_4_;
      local_7a8 = (float)local_4d8._0_4_ + local_4e8;
      fStack_7a4 = (float)local_4d8._4_4_ + fStack_4e4;
      fStack_7a0 = fStack_4d0 + fStack_4e0;
      fStack_79c = fStack_4cc + fStack_4dc;
      *(ulong *)*local_838 = CONCAT44(fStack_7a4,local_7a8);
      *(ulong *)(*local_838 + 8) = CONCAT44(fStack_79c,fStack_7a0);
      local_838 = local_838 + 1;
      local_768 = CONCAT44(local_7c8,local_7c8);
      uStack_760 = CONCAT44(local_7c8,local_7c8);
      uStack_744 = local_748;
      uStack_740 = local_748;
      uStack_73c = local_748;
      local_698 = local_758;
      uStack_690 = uStack_750;
      local_658 = local_758;
      uStack_650 = uStack_750;
      local_548 = local_5f8;
      uStack_540 = uStack_5f0;
      _local_4d8 = local_778;
      local_4c8 = local_618;
      uStack_4c0 = uStack_610;
      local_498 = local_4a8;
      uStack_490 = uStack_4a0;
      local_478 = uVar1;
      uStack_470 = uVar2;
      local_458 = CONCAT44(local_7c8,local_7c8);
      uStack_450 = CONCAT44(local_7c8,local_7c8);
      local_378 = local_3b8;
      uStack_370 = uStack_3b0;
      local_308 = local_348;
      uStack_300 = uStack_340;
      local_288 = local_508;
      uStack_280 = uStack_500;
      local_18 = local_618;
      uStack_10 = uStack_610;
    }
    for (; local_890 < local_82c; local_890 = local_890 + 1) {
      if (*(float *)*local_838 <= 0.0 && *(float *)*local_838 != 0.0) {
        fVar6 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        dVar4 = std::exp((double)(ulong)*(uint *)*local_838);
        *(float *)*local_838 = fVar6 * (SUB84(dVar4,0) - 1.0);
      }
      local_838 = (undefined1 (*) [16])(*local_838 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = static_cast<float>(alpha * (exp(*ptr) - 1.f));
            ptr++;
        }
    }

    return 0;
}